

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall
QFutureInterfaceBasePrivate::~QFutureInterfaceBasePrivate(QFutureInterfaceBasePrivate *this)

{
  ResultStoreBase *in_RDI;
  
  if ((in_RDI[4].resultCount & 0x10000) == 0) {
    QtPrivate::ResultStoreBase::~ResultStoreBase(in_RDI);
  }
  else {
    QtPrivate::ExceptionStore::~ExceptionStore((ExceptionStore *)0x6df4ce);
  }
  QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
  ::~QScopedPointer((QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
                     *)in_RDI);
  std::function<void_(const_QFutureInterfaceBase_&)>::~function
            ((function<void_(const_QFutureInterfaceBase_&)> *)0x6df500);
  Data::~Data((Data *)&in_RDI[1].m_filterMode);
  QWaitCondition::~QWaitCondition((QWaitCondition *)in_RDI);
  QWaitCondition::~QWaitCondition((QWaitCondition *)in_RDI);
  QList<QFutureCallOutInterface_*>::~QList((QList<QFutureCallOutInterface_*> *)0x6df538);
  QMutex::~QMutex((QMutex *)in_RDI);
  return;
}

Assistant:

QFutureInterfaceBasePrivate::~QFutureInterfaceBasePrivate()
{
    if (hasException)
        data.m_exceptionStore.~ExceptionStore();
    else
        data.m_results.~ResultStoreBase();
}